

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImVec2 IVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  byte in_SIL;
  long in_RDI;
  bool init_for_nav;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float fStack_28;
  ImVec2 local_24;
  
  pIVar3 = GImGui;
  bVar2 = false;
  if (((*(uint *)(in_RDI + 0xc) & 0x40000) == 0) &&
     (((((*(uint *)(in_RDI + 0xc) & 0x1000000) == 0 || ((*(uint *)(in_RDI + 0xc) & 0x4000000) != 0))
       || (*(int *)(in_RDI + 0x3d8) == 0)) || ((in_SIL & 1) != 0)))) {
    bVar2 = true;
  }
  if (bVar2) {
    SetNavID(0,GImGui->NavLayer);
    pIVar3->NavInitRequest = true;
    pIVar3->NavInitRequestFromMove = false;
    pIVar3->NavInitResultId = 0;
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    IVar1.y = fStack_28;
    IVar1.x = in_stack_ffffffffffffffd4;
    (pIVar3->NavInitResultRectRel).Min = IVar1;
    (pIVar3->NavInitResultRectRel).Max = local_24;
    NavUpdateAnyRequestFlag();
  }
  else {
    GImGui->NavId = *(ImGuiID *)(in_RDI + 0x3d8);
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    //IMGUI_DEBUG_LOG("[Nav] NavInitWindow() init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
    }
}